

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-queue.h
# Opt level: O0

Promise<unsigned_long> __thiscall
kj::ProducerConsumerQueue<unsigned_long>::pop(ProducerConsumerQueue<unsigned_long> *this)

{
  bool bVar1;
  reference t;
  unsigned_long *puVar2;
  list<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  unsigned_long local_20;
  unsigned_long value;
  ProducerConsumerQueue<unsigned_long> *this_local;
  
  this_local = this;
  bVar1 = std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::empty(in_RSI);
  if (bVar1) {
    WaiterQueue<unsigned_long>::wait((WaiterQueue<unsigned_long> *)this,in_RSI + 1);
  }
  else {
    bVar1 = WaiterQueue<unsigned_long>::empty((WaiterQueue<unsigned_long> *)(in_RSI + 1));
    if (!bVar1) {
      kj::_::inlineRequireFailure
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-queue.h"
                 ,0x92,"waiters.empty()","",(char *)0x0);
    }
    t = std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::back(in_RSI);
    puVar2 = mv<unsigned_long>(t);
    local_20 = *puVar2;
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::pop_back(in_RSI);
    puVar2 = mv<unsigned_long>(&local_20);
    Promise<unsigned_long>::Promise((Promise<unsigned_long> *)this,*puVar2);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<T> pop() {
    // Eventually pop a value from the queue.
    // Note that if your sinks lag your sources, the promise will always be ready.

    if (!values.empty()) {
      // We have at least one value, get the oldest.
      KJ_IASSERT(waiters.empty());

      auto value = kj::mv(values.back());
      values.pop_back();
      return kj::mv(value);
    } else {
      // We don't have any values, add ourselves to the waiting queue.
      return waiters.wait();
    }
  }